

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O1

params_t * __thiscall
iutest::detail::iuCsvFileParamsGenerator<float>::ReadParams
          (params_t *__return_storage_ptr__,iuCsvFileParamsGenerator<float> *this,string *path,
          char delimiter)

{
  char cVar1;
  long *plVar2;
  long lVar3;
  ostream *poVar4;
  string dataset;
  string data;
  long *local_1e0 [2];
  long local_1d0 [2];
  undefined1 local_1c0 [24];
  ostream local_1a8;
  
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (IFileSystem::GetInstanceVariable()::v == (long *)0x0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)(**(code **)(*IFileSystem::GetInstanceVariable()::v + 0x18))();
  }
  if (plVar2 != (long *)0x0) {
    cVar1 = (**(code **)(*plVar2 + 0x28))(plVar2,(path->_M_dataplus)._M_p,1);
    if (cVar1 != '\0') {
      (**(code **)(plVar2[1] + 0x20))(local_1e0,plVar2 + 1);
      lVar3 = std::__cxx11::string::find((char)local_1e0,(ulong)(uint)(int)delimiter);
      if (lVar3 != -1) {
        do {
          std::__cxx11::string::substr((ulong)local_1c0,(ulong)local_1e0);
          AppendParams(this,__return_storage_ptr__,(string *)local_1c0);
          if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
            operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
          }
          lVar3 = std::__cxx11::string::find((char)local_1e0,(ulong)(uint)(int)delimiter);
        } while (lVar3 != -1);
      }
      std::__cxx11::string::substr((ulong)local_1c0,(ulong)local_1e0);
      AppendParams(this,__return_storage_ptr__,(string *)local_1c0);
      if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
        operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
      }
      if ((__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_start ==
          (__return_storage_ptr__->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
          super__Vector_impl_data._M_finish) {
        IUTestLog::IUTestLog
                  ((IUTestLog *)local_1c0,LOG_WARNING,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_genparams_from_file.hpp"
                   ,0x4d);
        std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Empty params file \"",0x13);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (&local_1a8,(path->_M_dataplus)._M_p,path->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
        IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
      }
      if (local_1e0[0] != local_1d0) {
        operator_delete(local_1e0[0],local_1d0[0] + 1);
      }
      goto LAB_0012588a;
    }
  }
  IUTestLog::IUTestLog
            ((IUTestLog *)local_1c0,LOG_WARNING,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/include/internal/iutest_genparams_from_file.hpp"
             ,0x52);
  std::__ostream_insert<char,std::char_traits<char>>(&local_1a8,"Unable to open file \"",0x15);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (&local_1a8,(path->_M_dataplus)._M_p,path->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
  IUTestLog::~IUTestLog((IUTestLog *)local_1c0);
LAB_0012588a:
  if (IFileSystem::GetInstanceVariable()::v != (long *)0x0) {
    (**(code **)(*IFileSystem::GetInstanceVariable()::v + 0x20))
              (IFileSystem::GetInstanceVariable()::v,plVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

params_t ReadParams(const ::std::string& path, char delimiter = ',')
    {
        params_t params;
        IFile* fp = detail::IFileSystem::New();
        if( (fp != NULL) && fp->Open(path.c_str(), IFile::OpenRead) )
        {
            const ::std::string dataset = fp->ReadAll();
            ::std::string::size_type prev = 0;
            ::std::string::size_type pos = 0;
            while( static_cast<void>(pos = dataset.find(delimiter, prev)), pos != ::std::string::npos )
            {
                const ::std::string data = dataset.substr(prev, pos - prev);
                AppendParams(params, data);
                ++pos;
                prev = pos;
            }
            AppendParams(params, dataset.substr(prev));

            if( params.empty() )
            {
                IUTEST_LOG_(WARNING) << "Empty params file \"" << path << "\".";
            }
        }
        else
        {
            IUTEST_LOG_(WARNING) << "Unable to open file \"" << path << "\".";
        }
        detail::IFileSystem::Free(fp);
        return params;
    }